

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O2

bool __thiscall
glcts::TextureBorderClampSamplingTexture<float,_unsigned_char>::checkNearest
          (TextureBorderClampSamplingTexture<float,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,uchar expectedValue,
          uchar expectedBorderColor,GLint layer)

{
  ostringstream *this_00;
  ostringstream *poVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  MessageBuilder *pMVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  borderPoints;
  undefined1 local_1b0 [384];
  
  uVar2 = (this->m_test_configuration).m_width;
  uVar10 = (this->m_test_configuration).m_height;
  uVar3 = (this->m_test_configuration).m_n_in_components;
  uVar4 = (this->m_test_configuration).m_n_out_components;
  uVar7 = uVar2 >> 1;
  uVar12 = uVar10 >> 1;
  if (uVar4 < uVar3) {
    uVar3 = uVar4;
  }
  for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
    uVar9 = (uVar2 * uVar12 + uVar7) * uVar4 + (int)uVar13;
    if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] != expectedValue) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Wrong value for layer (");
      std::ostream::operator<<(poVar1,layer);
      std::operator<<((ostream *)poVar1,") at point (x,y)  = (");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,",");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,") , component (");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,")\n");
      std::operator<<((ostream *)poVar1,"Expected value [");
      std::ostream::operator<<(poVar1,(uint)expectedValue);
      std::operator<<((ostream *)poVar1,"]\n");
      std::operator<<((ostream *)poVar1,"Result   value [");
      std::ostream::operator<<
                (poVar1,(uint)(buffer->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar9]);
      std::operator<<((ostream *)poVar1,"]\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      return false;
    }
  }
  borderPoints.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  borderPoints.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  borderPoints.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = uVar2 / 6;
  uVar5 = uVar10 / 6;
  local_1b0._4_4_ = uVar5;
  local_1b0._0_4_ = uVar8;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar7;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar9 = (uint)(long)(((double)uVar2 / 6.0) * 5.0);
  local_1b0._0_4_ = uVar9;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._4_4_ = uVar12;
  local_1b0._0_4_ = uVar8;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar9;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar10 = (uint)(long)(((double)uVar10 / 6.0) * 5.0);
  local_1b0._4_4_ = uVar10;
  local_1b0._0_4_ = uVar8;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar7;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  local_1b0._0_4_ = uVar9;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::emplace_back<std::pair<unsigned_int,unsigned_int>>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)&borderPoints,(pair<unsigned_int,_unsigned_int> *)local_1b0);
  uVar13 = (long)borderPoints.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)borderPoints.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar10 = 0;
  do {
    uVar11 = (ulong)uVar10;
    if (uVar13 <= uVar11) {
LAB_00cb7397:
      std::
      _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Vector_base(&borderPoints.
                       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     );
      return uVar13 <= uVar11;
    }
    for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      uVar12 = (borderPoints.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar11].second * uVar2 +
               borderPoints.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11].first) * uVar4 + uVar7;
      if ((buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] != expectedBorderColor) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"Wrong value for layer (");
        std::ostream::operator<<(poVar1,layer);
        std::operator<<((ostream *)poVar1,") at point (x,y)  = (");
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,
                            &borderPoints.
                             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar11].first);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,",");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,&borderPoints.
                                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar11].second);
        this_00 = &pMVar6->m_str;
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        ") , component (");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,")\n");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Expected value [");
        std::ostream::operator<<(this_00,(uint)expectedBorderColor);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"]\n");
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Result   value [");
        std::ostream::operator<<
                  (this_00,(uint)(buffer->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar12]);
        std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"]\n");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        goto LAB_00cb7397;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkNearest(std::vector<OutputType>& buffer,
																			OutputType expectedValue,
																			OutputType expectedBorderColor,
																			glw::GLint layer)
{
	glw::GLuint width		   = m_test_configuration.get_width();
	glw::GLuint height		   = m_test_configuration.get_height();
	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;
	glw::GLuint index		   = 0;

	/* Check if center point is equal to expectedValue */
	std::pair<glw::GLuint, glw::GLuint> centerPoint(width / 2, height / 2);

	for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
	{
		index = centerPoint.second * outRowWidth + centerPoint.first * out_components + i;
		if (buffer[index] != expectedValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer << ") at point (x,y)  = ("
							   << centerPoint.first << "," << centerPoint.second << ") , component (" << i << ")\n"
							   << "Expected value [" << (glw::GLint)expectedValue << "]\n"
							   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
							   << tcu::TestLog::EndMessage;
			return false;
		}
	}

	/* Check if following points (marked as BC) contain values equal border color
	 *
	 *                 (-1, -1)    (0, -1)  (1,  -1)     (2, -1)
	 *                         *-------+-------+-------*
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 0) +-------+-------+-------+ (2, 0)
	 *                         |       |       |       |
	 *                         |  BC   |   0   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 1) +-------+-------+-------+ (2, 1)
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                         *-------+-------+-------*
	 *                 (-1, 2)      (0, 2)  (1, 2)       (2, 2)
	 */

	std::vector<std::pair<glw::GLuint, glw::GLuint> > borderPoints;

	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(
		std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), (glw::GLuint)(height / 6.0 * 5)));

	for (glw::GLuint j = 0; j < borderPoints.size(); ++j)
	{
		for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
		{
			index = borderPoints[j].second * outRowWidth + borderPoints[j].first * out_components + i;
			if (buffer[index] != expectedBorderColor)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer
								   << ") at point (x,y)  = (" << borderPoints[j].first << "," << borderPoints[j].second
								   << ") , component (" << i << ")\n"
								   << "Expected value [" << (glw::GLint)expectedBorderColor << "]\n"
								   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}